

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::RelationsAnalyzer::processOperation
          (RelationsAnalyzer *this,VRLocation *source,VRLocation *target,VROp *op)

{
  VROpType VVar1;
  I inst;
  bool bVar2;
  ValueRelations *this_00;
  ValueRelations *other;
  
  if (target != (VRLocation *)0x0) {
    this_00 = &target->relations;
    VVar1 = op->type;
    if (VVar1 == INSTRUCTION) {
      ValueRelations::merge(this_00,&source->relations,(Relations)0x3ff);
      inst = (I)op[1]._vptr_VROp;
      rememberValidated(this,&source->relations,this_00,inst);
      processInstruction(this,this_00,inst);
      return;
    }
    other = &source->relations;
    if ((VVar1 & ~INSTRUCTION) != ASSUME_BOOL) {
      ValueRelations::merge(this_00,other,(Relations)0xfff);
      return;
    }
    if (VVar1 == ASSUME_BOOL) {
      bVar2 = processAssumeBool(this,other,this_00,(VRAssumeBool *)op);
    }
    else {
      bVar2 = processAssumeEqual(other,this_00,(VRAssumeEqual *)op);
    }
    if (bVar2 != false) {
      ValueRelations::merge(this_00,other,(Relations)0xfff);
    }
    if (op->type == ASSUME_BOOL) {
      inferFromNEPointers(this,this_00,(VRAssumeBool *)op);
      return;
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::processOperation(VRLocation *source, VRLocation *target,
                                         VROp *op) {
    if (!target)
        return;
    assert(source && target && op);

    ValueRelations &newGraph = target->relations;

    if (op->isInstruction()) {
        newGraph.merge(source->relations, comparative);
        I inst = static_cast<VRInstruction *>(op)->getInstruction();
        rememberValidated(source->relations, newGraph, inst);
        processInstruction(newGraph, inst);

    } else if (op->isAssume()) {
        bool shouldMerge;
        if (op->isAssumeBool())
            shouldMerge = processAssumeBool(source->relations, newGraph,
                                            static_cast<VRAssumeBool *>(op));
        else // isAssumeEqual
            shouldMerge = processAssumeEqual(source->relations, newGraph,
                                             static_cast<VRAssumeEqual *>(op));
        if (shouldMerge) {
            __attribute__((unused)) bool result =
                    newGraph.merge(source->relations);
            assert(result);
        }

        if (op->isAssumeBool())
            inferFromNEPointers(newGraph, static_cast<VRAssumeBool *>(op));
    } else { // else op is noop
        newGraph.merge(source->relations, allRelations);
    }
}